

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CMU462::Application::to_model_mode(Application *this)

{
  bool bVar1;
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  *this_00;
  reference ppSVar2;
  reference pvVar3;
  char *pcVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  Mesh *local_30;
  SceneObject *o;
  iterator __end1;
  iterator __begin1;
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  *__range1;
  Application *this_local;
  
  if (*(int *)&(this->super_Renderer).field_0xc != 0) {
    PathTracer::stop(this->pathtracer);
    PathTracer::clear(this->pathtracer);
    *(undefined4 *)&(this->super_Renderer).field_0xc = 0;
    this_00 = &this->scene->objects;
    __end1 = std::
             set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
             ::begin(this_00);
    o = (SceneObject *)
        std::
        set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
        ::end(this_00);
    while (bVar1 = std::operator!=(&__end1,(_Self *)&o), bVar1) {
      ppSVar2 = std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator*
                          (&__end1);
      local_30 = (Mesh *)*ppSVar2;
      (*(local_30->super_SceneObject)._vptr_SceneObject[5])();
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_48,0);
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)pvVar3);
      bVar1 = false;
      if (*pcVar4 == 'M') {
        bVar1 = local_30 != (Mesh *)this->scene->elementTransform;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
      if (bVar1) {
        DynamicScene::Mesh::resetWave(local_30);
      }
      std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator++(&__end1);
    }
    this->action = Navigate;
    mouse_moved(this,this->mouseX,this->mouseY);
    setGhosted(this,false);
  }
  return;
}

Assistant:

void Application::to_model_mode() {
  if (mode == MODEL_MODE) return;
  pathtracer->stop();
  pathtracer->clear();
  mode = MODEL_MODE;
  for (auto o : scene->objects) {
    if (o->getInfo()[0][0] == 'M' && o != scene->elementTransform) { // Mesh
      ((DynamicScene::Mesh*)o)->resetWave();
    }
  }

  action = Action::Navigate;
  mouse_moved(mouseX, mouseY);
  setGhosted(false);
}